

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvector.cc
# Opt level: O0

DVector * fizplex::operator*(double c,DVector *vec)

{
  ulong uVar1;
  size_t *psVar2;
  double *pdVar3;
  DVector *in_RDI;
  DVector *in_XMM0_Qa;
  double dVar4;
  size_t i;
  size_t dim;
  DVector *result;
  size_t in_stack_ffffffffffffff88;
  DVector *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  DVector *this;
  undefined8 local_30;
  
  psVar2 = DVector::dimension(in_stack_ffffffffffffff90);
  uVar1 = *psVar2;
  DVector::DVector(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
    this = in_XMM0_Qa;
    pdVar3 = DVector::operator[](in_XMM0_Qa,(size_t)in_stack_ffffffffffffff98);
    dVar4 = (double)this * *pdVar3;
    in_stack_ffffffffffffff98 = DVector::operator[](this,(size_t)in_stack_ffffffffffffff98);
    *in_stack_ffffffffffffff98 = dVar4;
  }
  return in_RDI;
}

Assistant:

DVector operator*(const double c, const DVector &vec) {
  size_t dim = vec.dimension();
  DVector result(dim);
  for (size_t i = 0; i < dim; i++)
    result[i] = c * vec[i];
  return result;
}